

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

int __thiscall QFactoryLoader::indexOf(QFactoryLoader *this,QString *needle)

{
  QCborContainerPrivate *pQVar1;
  QCborValueConstRef QVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QCborValueConstRef QVar6;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QCborValueConstRef local_68;
  QArrayDataPointer<QCborArray> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QCborArray *)&DAT_aaaaaaaaaaaaaaaa;
  metaDataKeys((QList<QCborArray> *)&local_58,this);
  lVar4 = 0;
  do {
    if ((int)local_58.size <= lVar4) {
      iVar3 = -1;
LAB_002a97a6:
      QArrayDataPointer<QCborArray>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return iVar3;
      }
      __stack_chk_fail();
    }
    pQVar1 = local_58.ptr[lVar4].d.d.ptr;
    QVar6 = (QCborValueConstRef)QCborArray::constEnd(local_58.ptr + lVar4);
    lVar5 = 0;
    while (QVar2.i = lVar5, QVar2.d = pQVar1, QVar6 != QVar2) {
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      local_68.d = pQVar1;
      local_68.i = lVar5;
      QCborValueConstRef::toString((QString *)&local_80,&local_68,(QString *)&local_98);
      iVar3 = QString::compare((QString *)&local_80,needle,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      lVar5 = lVar5 + 1;
      if (iVar3 == 0) {
        iVar3 = (int)lVar4;
        goto LAB_002a97a6;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int QFactoryLoader::indexOf(const QString &needle) const
{
    const QList<QCborArray> metaDataList = metaDataKeys();
    for (int i = 0; i < int(metaDataList.size()); ++i) {
        const QCborArray &keys = metaDataList[i];
        for (QCborValueConstRef key : keys) {
            if (key.toString().compare(needle, Qt::CaseInsensitive) == 0)
                return i;
        }
    }
    return -1;
}